

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O1

boolean cursed_book(obj *bp)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ushort uVar5;
  char *pcVar6;
  bool bVar7;
  
  cVar1 = objects[bp->otyp].oc_oc2;
  uVar2 = mt_random();
  uVar3 = u.uprops[0x1e].intrinsic;
  switch(SUB168(ZEXT416(uVar2) % SEXT816((long)cVar1),0)) {
  case 0:
    pline("You feel a wrenching sensation.");
    tele((char *)0x0);
    return '\0';
  case 1:
    pline("You feel threatened.");
    aggravate();
    return '\0';
  case 2:
    uVar2 = mt_random();
    make_blinded((ulong)(uVar3 + uVar2 % 100 + 0xfa),'\x01');
    break;
  case 3:
    take_gold();
    break;
  case 4:
    pline("These runes were just too much to comprehend.");
    uVar3 = u.uprops[0x1c].intrinsic;
    uVar2 = mt_random();
    make_confused((ulong)(uVar3 + uVar2 % 7 + 0x10),'\0');
    return '\0';
  case 5:
    pline("The book was coated with contact poison!");
    if (uarmg == (obj *)0x0) {
      bp->field_0x4c = bp->field_0x4c & 0x7f;
      bVar7 = (youmonst.mintrinsics & 0x20) == 0;
      uVar3 = 1;
      if (u.uprops[6].extrinsic == 0 && u.uprops[6].intrinsic == 0) {
        uVar3 = bVar7 + 1 + (uint)bVar7;
      }
      uVar2 = mt_random();
      losestr(uVar3 + (uVar2 & uVar3),'\0');
      if (((((u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) &&
            ((youmonst.mintrinsics & 0x20) == 0)) ||
           ((uVar3 = 6, (u.uprops[6].intrinsic >> 0x1a & 1) != 0 &&
            (((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0 &&
             ((youmonst.mintrinsics & 0x20) == 0)))))) &&
          (uVar3 = 10, (u.uprops[6].intrinsic >> 0x1a & 1) != 0)) &&
         ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) {
        uVar3 = (uint)(((byte)youmonst.mintrinsics & 0x20) >> 5) * 2 + 8;
      }
      uVar2 = mt_random();
      losehp(uVar2 % uVar3 + 1,"contact-poisoned spellbook",0);
      bp->field_0x4c = bp->field_0x4c | 0x80;
      return '\0';
    }
    uVar3 = *(uint *)&uarmg->field_0x4a;
    if (((uVar3 >> 0xc & 1) != 0) ||
       ((uVar5 = *(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f, uVar5 != 0xb &&
        (uVar5 != 0xd)))) {
      pline("Your gloves seem unaffected.");
      return '\0';
    }
    uVar2 = uVar3 >> 10 & 3;
    if (uVar2 == 3) {
      if ((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
        pcVar4 = "look";
      }
      else if (ublindf == (obj *)0x0) {
        pcVar4 = "feel";
      }
      else {
        pcVar4 = "feel";
        if (ublindf->oartifact == '\x1d') {
          pcVar4 = "look";
        }
      }
      pline("Your gloves %s completely corroded.",pcVar4);
      return '\0';
    }
    if ((uVar3 >> 0x14 & 1) == 0) {
      pcVar4 = " further";
      if (uVar2 == 0) {
        pcVar4 = "";
      }
      pcVar6 = " completely";
      if (uVar2 != 2) {
        pcVar6 = pcVar4;
      }
      pline("Your gloves corrode%s!",pcVar6);
      *(uint *)&uarmg->field_0x4a =
           *(uint *)&uarmg->field_0x4a & 0xfffff3ff | *(uint *)&uarmg->field_0x4a + 0x400 & 0xc00;
      return '\0';
    }
    grease_protect(uarmg,"gloves",&youmonst);
    break;
  case 6:
    pcVar4 = body_part(2);
    pline("As you read the book, it %s in your %s!","radiates explosive energy",pcVar4);
    uVar3 = mt_random();
    mana_damageu((uVar3 % 10) * 2 + 7,(monst *)0x0,"exploding rune",0,'\0');
    return '\x01';
  default:
    rndcurse();
  }
  return '\0';
}

Assistant:

static boolean cursed_book(struct obj *bp)
{
	int lev = objects[bp->otyp].oc_level;

	switch(rn2(lev)) {
	case 0:
		pline("You feel a wrenching sensation.");
		tele(NULL);		/* teleport him */
		break;
	case 1:
		pline("You feel threatened.");
		aggravate();
		break;
	case 2:
		make_blinded(Blinded + rn1(100,250),TRUE);
		break;
	case 3:
		take_gold();
		break;
	case 4:
		pline("These runes were just too much to comprehend.");
		make_confused(HConfusion + rn1(7,16),FALSE);
		break;
	case 5:
		pline("The book was coated with contact poison!");
		if (uarmg) {
		    if (uarmg->oerodeproof || !is_corrodeable(uarmg)) {
			pline("Your gloves seem unaffected.");
		    } else if (uarmg->oeroded2 < MAX_ERODE) {
			if (uarmg->greased) {
			    grease_protect(uarmg, "gloves", &youmonst);
			} else {
			    pline("Your gloves corrode%s!",
				 uarmg->oeroded2+1 == MAX_ERODE ?
				 " completely" : uarmg->oeroded2 ?
				 " further" : "");
			    uarmg->oeroded2++;
			}
		    } else
			pline("Your gloves %s completely corroded.",
			     Blind ? "feel" : "look");
		    break;
		}
		/* temp disable in_use; death should not destroy the book */
		bp->in_use = FALSE;
		losestr(Poison_resistance ? rn1(2,1) : rn1(4,3), FALSE);
		losehp(rnd(FPoison_resistance ? 6 :
			   PPoison_resistance ? 8 : 10),
		       "contact-poisoned spellbook", KILLED_BY_AN);
		bp->in_use = TRUE;
		break;
	case 6:
		pline("As you read the book, it %s in your %s!",
		      explodes, body_part(FACE));
		mana_damageu(2 * rnd(10) + 5, NULL,
			     "exploding rune", KILLED_BY_AN, FALSE);
		return TRUE;
	default:
		rndcurse();
		break;
	}
	return FALSE;
}